

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O1

GLuint gl4cts::CopyImage::Utils::prepareTex16x16x6
                 (Context *context,GLenum target,GLenum internal_format,GLenum format,GLenum type,
                 GLuint *out_buf_id)

{
  GLuint name;
  
  name = generateTexture(context,target);
  prepareTexture(context,name,target,internal_format,format,type,0,0x10,0x10,6,(GLvoid *)0x0,
                 out_buf_id);
  return name;
}

Assistant:

GLuint Utils::prepareTex16x16x6(deqp::Context& context, GLenum target, GLenum internal_format, GLenum format,
								GLenum type, GLuint& out_buf_id)
{
	static const GLuint  depth  = 6;
	static const GLuint  height = 16;
	static const GLuint  level  = 0;
	GLuint				 name   = 0;
	static const GLchar* pixels = 0;
	static const GLuint  width  = 16;

	name = generateTexture(context, target);

	prepareTexture(context, name, target, internal_format, format, type, level, width, height, depth, pixels,
				   out_buf_id);

	return name;
}